

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyDropFontElements(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Node *local_28;
  Node *next;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  next = (Node *)pnode;
  pnode_local = &node->parent;
  node_local = &doc->root;
  while (pnode_local != (Node **)0x0) {
    local_28 = pnode_local[2];
    if (((pnode_local == (Node **)0x0) || (pnode_local[7] == (Node *)0x0)) ||
       (*(int *)&pnode_local[7]->parent != 0x24)) {
      if (pnode_local[3] != (Node *)0x0) {
        prvTidyDropFontElements((TidyDocImpl *)node_local,pnode_local[3],&local_28);
      }
      pnode_local = &local_28->parent;
    }
    else {
      DiscardContainer((TidyDocImpl *)node_local,(Node *)pnode_local,&local_28);
      pnode_local = &local_28->parent;
    }
  }
  return;
}

Assistant:

void TY_(DropFontElements)(TidyDocImpl* doc, Node* node, Node **ARG_UNUSED(pnode))
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (nodeIsFONT(node))
        {
            DiscardContainer(doc, node, &next);
            node = next;
            continue;
        }

        if (node->content)
            TY_(DropFontElements)(doc, node->content, &next);

        node = next;
    }
}